

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  size_t sVar5;
  LargeHeapBlock *next;
  LargeHeapBlock *heapBlock_local;
  LargeHeapBucket *this_local;
  
  if ((heapBlock->hasPartialFreeObjects & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b3,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = LargeHeapBlock::IsInPendingDisposeList(heapBlock);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2b4,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->largeBlockList != (LargeHeapBlock *)0x0) {
    sVar4 = LargeHeapBlock::GetFreeSize(heapBlock);
    sVar5 = LargeHeapBlock::GetFreeSize(this->largeBlockList);
    if (sVar5 < sVar4) {
      next = LargeHeapBlock::GetNextBlock(this->largeBlockList);
      LargeHeapBlock::SetNextBlock(heapBlock,next);
      LargeHeapBlock::SetNextBlock(this->largeBlockList,this->fullLargeBlockList);
      this->fullLargeBlockList = this->largeBlockList;
      this->largeBlockList = heapBlock;
      return;
    }
  }
  LargeHeapBlock::SetNextBlock(heapBlock,this->fullLargeBlockList);
  this->fullLargeBlockList = heapBlock;
  return;
}

Assistant:

void
LargeHeapBucket::ReinsertLargeHeapBlock(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    if (this->largeBlockList != nullptr && heapBlock->GetFreeSize() > this->largeBlockList->GetFreeSize())
    {
        heapBlock->SetNextBlock(this->largeBlockList->GetNextBlock());
        this->largeBlockList->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = this->largeBlockList;
        this->largeBlockList = heapBlock;
    }
    else
    {
        heapBlock->SetNextBlock(this->fullLargeBlockList);
        this->fullLargeBlockList = heapBlock;
    }
}